

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

ConstTokenOrSyntax * __thiscall
slang::syntax::UdpEdgeFieldSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,UdpEdgeFieldSyntax *this,size_t index)

{
  undefined4 uVar1;
  uint32_t uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  switch(index) {
  case 0:
    uVar1._0_2_ = (this->openParen).kind;
    uVar1._2_1_ = (this->openParen).field_0x2;
    uVar1._3_1_ = (this->openParen).numFlags;
    uVar2 = (this->openParen).rawLen;
    uVar3 = *(undefined4 *)&(this->openParen).info;
    uVar4 = *(undefined4 *)((long)&(this->openParen).info + 4);
    break;
  case 1:
    uVar1._0_2_ = (this->first).kind;
    uVar1._2_1_ = (this->first).field_0x2;
    uVar1._3_1_ = (this->first).numFlags;
    uVar2 = (this->first).rawLen;
    uVar3 = *(undefined4 *)&(this->first).info;
    uVar4 = *(undefined4 *)((long)&(this->first).info + 4);
    break;
  case 2:
    uVar1._0_2_ = (this->second).kind;
    uVar1._2_1_ = (this->second).field_0x2;
    uVar1._3_1_ = (this->second).numFlags;
    uVar2 = (this->second).rawLen;
    uVar3 = *(undefined4 *)&(this->second).info;
    uVar4 = *(undefined4 *)((long)&(this->second).info + 4);
    break;
  case 3:
    uVar1._0_2_ = (this->closeParen).kind;
    uVar1._2_1_ = (this->closeParen).field_0x2;
    uVar1._3_1_ = (this->closeParen).numFlags;
    uVar2 = (this->closeParen).rawLen;
    uVar3 = *(undefined4 *)&(this->closeParen).info;
    uVar4 = *(undefined4 *)((long)&(this->closeParen).info + 4);
    break;
  default:
    parsing::Token::Token((Token *)__return_storage_ptr__);
    goto LAB_0027e13f;
  }
  *(undefined4 *)
   &(__return_storage_ptr__->super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
    ).super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = uVar1;
  *(uint32_t *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   4) = uVar2;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   8) = uVar3;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0xc) = uVar4;
LAB_0027e13f:
  *(__index_type *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0x10) = '\0';
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax UdpEdgeFieldSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return openParen;
        case 1: return first;
        case 2: return second;
        case 3: return closeParen;
        default: return nullptr;
    }
}